

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

char * bignum_to_string(BIGNUM *bn)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *local_38;
  BIGNUM *local_28;
  char *ret;
  char *tmp;
  BIGNUM *bn_local;
  
  tmp = (char *)bn;
  uVar1 = BN_num_bits((BIGNUM *)bn);
  if (uVar1 < 0x20) {
    bn_local = (BIGNUM *)BN_bn2dec((BIGNUM *)tmp);
  }
  else {
    ret = BN_bn2hex((BIGNUM *)tmp);
    if (ret == (char *)0x0) {
      bn_local = (BIGNUM *)0x0;
    }
    else {
      pcVar3 = "";
      if (*ret == '-') {
        pcVar3 = "-";
      }
      local_38 = ret;
      if (*ret == '-') {
        local_38 = ret + 1;
      }
      iVar2 = OPENSSL_asprintf((char **)&local_28,"%s0x%s",pcVar3,local_38);
      if (iVar2 == -1) {
        local_28 = (BIGNUM *)0x0;
      }
      OPENSSL_free(ret);
      bn_local = local_28;
    }
  }
  return (char *)bn_local;
}

Assistant:

static char *bignum_to_string(const BIGNUM *bn) {
  char *tmp, *ret;

  // Display large numbers in hex and small numbers in decimal. Converting to
  // decimal takes quadratic time and is no more useful than hex for large
  // numbers.
  if (BN_num_bits(bn) < 32) {
    return BN_bn2dec(bn);
  }

  tmp = BN_bn2hex(bn);
  if (tmp == NULL) {
    return NULL;
  }

  // Prepend "0x", but place it after the "-" if negative.
  if (OPENSSL_asprintf(&ret, "%s0x%s", (tmp[0] == '-') ? "-" : "",
                       (tmp[0] == '-') ? tmp + 1 : tmp) == -1) {
    ret = nullptr;
  }
  OPENSSL_free(tmp);
  return ret;
}